

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_namespace_special(writer *w,string_view *namespace_name)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  string_view *psVar1;
  bool bVar2;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  size_t local_248;
  char *local_240;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  size_t local_218;
  char *local_210;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  size_t local_1e8;
  char *local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  size_t local_1b8;
  char *local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  size_t local_188;
  char *local_180;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  size_t local_158;
  char *local_150;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  size_t local_a8;
  char *local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_t local_28;
  char *local_20;
  string_view *local_18;
  string_view *namespace_name_local;
  writer *w_local;
  
  local_28 = namespace_name->_M_len;
  local_20 = namespace_name->_M_str;
  local_18 = namespace_name;
  namespace_name_local = (string_view *)w;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"Windows.Foundation");
  __x_06._M_str = local_20;
  __x_06._M_len = local_28;
  __y_06._M_str = local_38._M_str;
  __y_06._M_len = local_38._M_len;
  bVar2 = ::std::operator==(__x_06,__y_06);
  psVar1 = namespace_name_local;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,
               "\nnamespace winrt::impl\n{\n    template <typename T>\n    struct reference : implements<reference<T>, Windows::Foundation::IReference<T>, Windows::Foundation::IPropertyValue>\n    {\n        reference(T const& value) : m_value(value)\n        {\n        }\n\n        T Value() const\n        {\n            return m_value;\n        }\n\n        Windows::Foundation::PropertyType Type() const noexcept\n        {\n            return Windows::Foundation::PropertyType::OtherType;\n        }\n\n        static constexpr bool IsNumericScalar() noexcept\n        {\n            return std::is_arithmetic_v<T> || std::is_enum_v<T>;\n        }\n\n        uint8_t GetUInt8() const\n        {\n            return to_scalar<uint8_t>();\n        }\n\n        int16_t GetInt16() const\n        {\n            return to_scalar<int16_t>();\n        }\n\n        uint16_t GetUInt16() const\n        {\n            return to_scalar<uint16_t>();\n        }\n\n        int32_t GetInt32() const\n        {\n            return to_scalar<int32_t>();\n        }\n\n        uint32_t GetUInt32() const\n        {\n            return to_scalar<uint32_t>();\n        }\n\n        int64_t GetInt64() const\n        {\n            return to_scalar<int64_t>();\n        }\n\n        uint64_t GetUInt64() const\n        {\n            return to_scalar<uint64_t>();\n        }\n\n        float GetSingle() { throw hresult_not_implemented(); }\n        double GetDouble() { throw hresult_not_implemented(); }\n        char16_t GetChar16() { throw hresult_not_implemented(); }\n        bool GetBoolean() { throw hresult_not_implemented(); }\n        hstring GetString() { throw hresult_not_implemented(); }\n        guid GetGuid() { throw hresult_not_implemented(); }\n        Windows::Foundation::DateTime GetDateTime() { throw hresult_not_implemented(); }\n        Windows::Foundation::TimeSpan GetTimeSpan() { throw hresult_not_implemented(); }\n        Windows::Foundation::Point GetPoint() { throw hresult_not_implemented(); }\n        Windows::Foundation::Size GetSize() { throw hresult_not_implemented(); }\n        Windows::Foundation::Rect G..." /* TRUNCATED STRING LITERAL */
              );
    writer_base<cppwinrt::writer>::write
              ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_48,__buf,(size_t)local_38._M_str)
    ;
    psVar1 = namespace_name_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_58,
               "\nWINRT_EXPORT namespace winrt\n{\n#ifdef WINRT_IMPL_COROUTINES\n    template<typename D>\n    struct deferrable_event_args\n    {\n        Windows::Foundation::Deferral GetDeferral()\n        {\n            slim_lock_guard const guard(m_lock);\n\n            if (m_handle)\n            {\n                // Cannot ask for deferral after the event handler returned.\n                throw hresult_illegal_method_call();\n            }\n\n            Windows::Foundation::Deferral deferral{ {static_cast<D&>(*this).get_strong(), &deferrable_event_args::one_deferral_completed } };\n            ++m_outstanding_deferrals;\n            return deferral;\n        }\n\n        [[nodiscard]] Windows::Foundation::IAsyncAction wait_for_deferrals()\n        {\n            struct awaitable : impl::suspend_always\n            {\n                bool await_suspend(coroutine_handle handle)\n                {\n                    return m_deferrable.await_suspend(handle);\n                }\n\n                deferrable_event_args& m_deferrable;\n            };\n\n            co_await awaitable{ {}, *this };\n        }\n\n    private:\n\n        using coroutine_handle = impl::coroutine_handle<>;\n\n        void one_deferral_completed()\n        {\n            coroutine_handle resume = nullptr;\n            {\n                slim_lock_guard const guard(m_lock);\n\n                if (m_outstanding_deferrals <= 0)\n                {\n                    throw hresult_illegal_method_call();\n                }\n\n                if (--m_outstanding_deferrals == 0)\n                {\n                    resume = m_handle;\n                }\n            }\n\n            if (resume)\n            {\n                impl::resume_background(resume);\n            }\n        }\n\n        bool await_suspend(coroutine_handle handle) noexcept\n        {\n            slim_lock_guard const guard(m_lock);\n            m_handle = handle;\n            return m_outstanding_deferrals > 0;\n        }\n\n        slim_mutex m_lock;\n        int32_t m_outstanding_deferrals = 0;\n        coroutine_handle m_handle = nullptr;\n    }..." /* TRUNCATED STRING LITERAL */
              );
    writer_base<cppwinrt::writer>::write
              ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_58,__buf_00,
               (size_t)local_38._M_str);
    psVar1 = namespace_name_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_68,
               "\nnamespace winrt::impl\n{\n    template <typename Async>\n    struct async_completed_handler;\n\n    template <typename Async>\n    using async_completed_handler_t = typename async_completed_handler<Async>::type;\n\n    template <>\n    struct async_completed_handler<Windows::Foundation::IAsyncAction>\n    {\n        using type = Windows::Foundation::AsyncActionCompletedHandler;\n    };\n\n    template <typename TProgress>\n    struct async_completed_handler<Windows::Foundation::IAsyncActionWithProgress<TProgress>>\n    {\n        using type = Windows::Foundation::AsyncActionWithProgressCompletedHandler<TProgress>;\n    };\n\n    template <typename TResult>\n    struct async_completed_handler<Windows::Foundation::IAsyncOperation<TResult>>\n    {\n        using type = Windows::Foundation::AsyncOperationCompletedHandler<TResult>;\n    };\n\n    template <typename TResult, typename TProgress>\n    struct async_completed_handler<Windows::Foundation::IAsyncOperationWithProgress<TResult, TProgress>>\n    {\n        using type = Windows::Foundation::AsyncOperationWithProgressCompletedHandler<TResult, TProgress>;\n    };\n\n    inline void check_sta_blocking_wait() noexcept\n    {\n        // Note: A blocking wait on the UI thread for an asynchronous operation can cause a deadlock.\n        // See https://docs.microsoft.com/windows/uwp/cpp-and-winrt-apis/concurrency#block-the-calling-thread\n        WINRT_ASSERT(!is_sta_thread());\n    }\n\n    template <typename T, typename H>\n    std::pair<T, H*> make_delegate_with_shared_state(H&& handler)\n    {\n        auto d = make_delegate<T, H>(std::forward<H>(handler));\n        auto abi = reinterpret_cast<delegate<T, H>*>(get_abi(d));\n        return { std::move(d), abi };\n    }\n\n    template <typename Async>\n    auto wait_for_completed(Async const& async, uint32_t const timeout)\n    {\n        struct shared_type\n        {\n            handle event{ check_pointer(WINRT_IMPL_CreateEventW(nullptr, true, false, nullptr)) };\n            Windows::Foundation::AsyncStatus status{ Windows::Foundation::AsyncStatus::Started };\n\n  ..." /* TRUNCATED STRING LITERAL */
              );
    writer_base<cppwinrt::writer>::write
              ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_68,__buf_01,
               (size_t)local_38._M_str);
    psVar1 = namespace_name_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,
               "\nWINRT_EXPORT namespace winrt\n{\n    inline hstring to_hstring(Windows::Foundation::IStringable const& stringable)\n    {\n        return stringable.ToString();\n    }\n}\n"
              );
    writer_base<cppwinrt::writer>::write
              ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_78,__buf_02,
               (size_t)local_38._M_str);
    psVar1 = namespace_name_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_88,
               "\n#ifdef __cpp_lib_format\ntemplate <typename FormatContext>\nauto std::formatter<winrt::Windows::Foundation::IStringable, wchar_t>::format(winrt::Windows::Foundation::IStringable const& obj, FormatContext& fc) const\n{\n    return std::formatter<winrt::hstring, wchar_t>::format(obj.ToString(), fc);\n}\n#endif\n"
              );
    writer_base<cppwinrt::writer>::write
              ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_88,__buf_03,
               (size_t)local_38._M_str);
    psVar1 = namespace_name_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,
               "\n#ifndef WINRT_LEAN_AND_MEAN\ninline std::wostream& operator<<(std::wostream& stream, winrt::Windows::Foundation::IStringable const& stringable)\n{\n    stream << stringable.ToString();\n    return stream;\n}\n#endif\n"
              );
    writer_base<cppwinrt::writer>::write
              ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_98,__buf_04,
               (size_t)local_38._M_str);
  }
  else {
    local_a8 = local_18->_M_len;
    local_a0 = local_18->_M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_b8,"Windows.Foundation.Collections");
    __x_05._M_str = local_a0;
    __x_05._M_len = local_a8;
    __y_05._M_str = local_b8._M_str;
    __y_05._M_len = local_b8._M_len;
    bVar2 = ::std::operator==(__x_05,__y_05);
    psVar1 = namespace_name_local;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_c8,
                 "\nnamespace winrt::impl\n{\n    namespace wfc = Windows::Foundation::Collections;\n\n    template <typename D, typename T>\n    auto consume_Windows_Foundation_Collections_IIterable<D, T>::begin() const\n    {\n        return get_begin_iterator(static_cast<D const&>(*this));\n    }\n    template <typename D, typename T>\n    auto consume_Windows_Foundation_Collections_IIterable<D, T>::end() const\n    {\n        return get_end_iterator(static_cast<D const&>(*this));\n    }\n\n    template <typename T>\n    struct key_value_pair;\n\n    template <typename K, typename V>\n    struct key_value_pair<wfc::IKeyValuePair<K, V>> : implements<key_value_pair<wfc::IKeyValuePair<K, V>>, wfc::IKeyValuePair<K, V>>\n    {\n        key_value_pair(K key, V value) :\n            m_key(std::move(key)),\n            m_value(std::move(value))\n        {\n        }\n\n        K Key() const\n        {\n            return m_key;\n        }\n\n        V Value() const\n        {\n            return m_value;\n        }\n\n    private:\n\n        K const m_key;\n        V const m_value;\n    };\n\n    template <typename T>\n    struct is_key_value_pair : std::false_type {};\n\n    template <typename K, typename V>\n    struct is_key_value_pair<wfc::IKeyValuePair<K, V>> : std::true_type {};\n\n    struct input_scope\n    {\n        void invalidate_scope() noexcept\n        {\n            m_invalid = true;\n        }\n\n        void check_scope() const\n        {\n            if (m_invalid)\n            {\n                throw hresult_illegal_method_call();\n            }\n        }\n\n    private:\n\n        bool m_invalid{};\n    };\n\n    struct no_collection_version\n    {\n        struct iterator_type\n        {\n            iterator_type(no_collection_version const&) noexcept\n            {\n            }\n\n            void check_version(no_collection_version const&) const noexcept\n            {\n            }\n        };\n    };\n\n    struct collection_version\n    {\n        struct iterator_type\n        {\n            iterator_type(collection_version const& version) noexcept :\n                m_snapshot(version.get_..." /* TRUNCATED STRING LITERAL */
                );
      writer_base<cppwinrt::writer>::write
                ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_c8,__buf_05,
                 (size_t)local_b8._M_str);
      psVar1 = namespace_name_local;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_d8,
                 "namespace winrt::impl\n{\n    struct nop_lock_guard {};\n\n    struct single_threaded_collection_base\n    {\n        [[nodiscard]] auto acquire_exclusive() const\n        {\n            return nop_lock_guard{};\n        }\n\n        [[nodiscard]] auto acquire_shared() const\n        {\n            return nop_lock_guard();\n        }\n    };\n\n    struct multi_threaded_collection_base\n    {\n        [[nodiscard]] auto acquire_exclusive() const\n        {\n            return slim_lock_guard{m_mutex};\n        }\n\n        [[nodiscard]] auto acquire_shared() const\n        {\n            return slim_shared_lock_guard{m_mutex};\n        }\n\n    private:\n\n        mutable slim_mutex m_mutex;\n    };\n\n    template <typename D>\n    using container_type_t = std::decay_t<decltype(std::declval<D>().get_container())>;\n\n    template <typename D, typename = void>\n    struct removed_values\n    {\n        void assign(container_type_t<D>& value)\n        {\n            // Trivially destructible; okay to run destructors under lock and clearing allows potential re-use of buffers\n            value.clear();\n        }\n    };\n\n    template <typename D>\n    struct removed_values<D, std::enable_if_t<!std::is_trivially_destructible_v<typename container_type_t<D>::value_type>>>\n    {\n        container_type_t<D> m_value;\n\n        void assign(container_type_t<D>& value)\n        {\n            m_value.swap(value);\n        }\n    };\n\n    template <typename T, typename = void>\n    struct removed_value\n    {\n        // Trivially destructible; okay to run destructor under lock\n        template <typename U>\n        void assign(U&&) {}\n    };\n\n    template <typename T>\n    struct removed_value<T, std::enable_if_t<std::is_move_constructible_v<T> && !std::is_trivially_destructible_v<T>>>\n    {\n        std::optional<T> m_value;\n\n        template <typename U>\n        void assign(U&& value)\n        {\n            m_value.emplace(std::move(value));\n        }\n    };\n}\n\nWINRT_EXPORT namespace winrt\n{\n    template <typename D, typename T, typename Version = impl::no_collection_version>\n  ..." /* TRUNCATED STRING LITERAL */
                );
      writer_base<cppwinrt::writer>::write
                ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_d8,__buf_06,
                 (size_t)local_b8._M_str);
      psVar1 = namespace_name_local;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_e8,
                 "\nnamespace winrt::impl\n{\n    template <typename T, typename Container>\n    struct input_iterable :\n        implements<input_iterable<T, Container>, non_agile, no_weak_ref, wfc::IIterable<T>>,\n        iterable_base<input_iterable<T, Container>, T>\n    {\n        static_assert(std::is_same_v<Container, std::remove_reference_t<Container>>, \"Must be constructed with rvalue.\");\n\n        explicit input_iterable(Container&& values) : m_values(std::forward<Container>(values))\n        {\n        }\n\n        auto& get_container() const noexcept\n        {\n            return m_values;\n        }\n\n    private:\n\n        Container const m_values;\n    };\n\n    template <typename T, typename InputIt>\n    struct scoped_input_iterable :\n        input_scope,\n        implements<scoped_input_iterable<T, InputIt>, non_agile, no_weak_ref, wfc::IIterable<T>>,\n        iterable_base<scoped_input_iterable<T, InputIt>, T>\n    {\n        void abi_enter() const\n        {\n            check_scope();\n        }\n\n        scoped_input_iterable(InputIt first, InputIt last) : m_begin(first), m_end(last)\n        {\n        }\n\n        auto get_container() const noexcept\n        {\n            return range_container<InputIt>{ m_begin, m_end };\n        }\n\n#if defined(_DEBUG) && !defined(WINRT_NO_MAKE_DETECTION)\n        void use_make_function_to_create_this_object() final\n        {\n        }\n#endif\n\n    private:\n\n        InputIt const m_begin;\n        InputIt const m_end;\n    };\n\n    template <typename T, typename Container>\n    auto make_input_iterable(Container&& values)\n    {\n        return make<input_iterable<T, Container>>(std::forward<Container>(values));\n    }\n\n    template <typename T, typename InputIt>\n    auto make_scoped_input_iterable(InputIt first, InputIt last)\n    {\n        using interface_type = wfc::IIterable<T>;\n        std::pair<interface_type, input_scope*> result;\n        auto ptr = new scoped_input_iterable<T, InputIt>(first, last);\n        *put_abi(result.first) = to_abi<interface_type>(ptr);\n        result.second = ptr;\n        return resul..." /* TRUNCATED STRING LITERAL */
                );
      writer_base<cppwinrt::writer>::write
                ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_e8,__buf_07,
                 (size_t)local_b8._M_str);
      psVar1 = namespace_name_local;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_f8,
                 "\nnamespace winrt::impl\n{\n    template <typename T, typename Container>\n    struct input_vector_view :\n        implements<input_vector_view<T, Container>, non_agile, no_weak_ref, wfc::IVectorView<T>, wfc::IIterable<T>>,\n        vector_view_base<input_vector_view<T, Container>, T>\n    {\n        static_assert(std::is_same_v<Container, std::remove_reference_t<Container>>, \"Must be constructed with rvalue.\");\n\n        explicit input_vector_view(Container&& values) : m_values(std::forward<Container>(values))\n        {\n        }\n\n        auto& get_container() const noexcept\n        {\n            return m_values;\n        }\n\n    private:\n\n        Container const m_values;\n    };\n\n    template <typename T, typename InputIt>\n    struct scoped_input_vector_view :\n        input_scope,\n        implements<scoped_input_vector_view<T, InputIt>, non_agile, no_weak_ref, wfc::IVectorView<T>, wfc::IIterable<T>>,\n        vector_view_base<scoped_input_vector_view<T, InputIt>, T>\n    {\n        void abi_enter() const\n        {\n            check_scope();\n        }\n\n        scoped_input_vector_view(InputIt first, InputIt last) : m_begin(first), m_end(last)\n        {\n        }\n\n        auto get_container() const noexcept\n        {\n            return range_container<InputIt>{ m_begin, m_end };\n        }\n\n#if defined(_DEBUG) && !defined(WINRT_NO_MAKE_DETECTION)\n        void use_make_function_to_create_this_object() final\n        {\n        }\n#endif\n\n    private:\n\n        InputIt const m_begin;\n        InputIt const m_end;\n    };\n\n    template <typename T, typename InputIt>\n    auto make_scoped_input_vector_view(InputIt first, InputIt last)\n    {\n        using interface_type = wfc::IVectorView<T>;\n        std::pair<interface_type, input_scope*> result;\n        auto ptr = new scoped_input_vector_view<T, InputIt>(first, last);\n        *put_abi(result.first) = to_abi<interface_type>(ptr);\n        result.second = ptr;\n        return result;\n    }\n}\n\nWINRT_EXPORT namespace winrt::param\n{\n    template <typename T>\n    struct vector_view\n    {\n       ..." /* TRUNCATED STRING LITERAL */
                );
      writer_base<cppwinrt::writer>::write
                ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_f8,__buf_08,
                 (size_t)local_b8._M_str);
      psVar1 = namespace_name_local;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_108,
                 "\nnamespace winrt::impl\n{\n    template <typename K, typename V, typename Container>\n    struct input_map_view :\n        implements<input_map_view<K, V, Container>, non_agile, no_weak_ref, wfc::IMapView<K, V>, wfc::IIterable<wfc::IKeyValuePair<K, V>>>,\n        map_view_base<input_map_view<K, V, Container>, K, V>\n    {\n        static_assert(std::is_same_v<Container, std::remove_reference_t<Container>>, \"Must be constructed with rvalue.\");\n\n        explicit input_map_view(Container&& values) : m_values(std::forward<Container>(values))\n        {\n        }\n\n        auto& get_container() const noexcept\n        {\n            return m_values;\n        }\n\n    private:\n\n        Container const m_values;\n    };\n\n    template <typename K, typename V, typename Container>\n    struct scoped_input_map_view :\n        input_scope,\n        implements<scoped_input_map_view<K, V, Container>, non_agile, no_weak_ref, wfc::IMapView<K, V>, wfc::IIterable<wfc::IKeyValuePair<K, V>>>,\n        map_view_base<scoped_input_map_view<K, V, Container>, K, V>\n    {\n        void abi_enter() const\n        {\n            check_scope();\n        }\n\n        explicit scoped_input_map_view(Container const& values) : m_values(values)\n        {\n        }\n\n        auto& get_container() const noexcept\n        {\n            return m_values;\n        }\n\n#if defined(_DEBUG) && !defined(WINRT_NO_MAKE_DETECTION)\n        void use_make_function_to_create_this_object() final\n        {\n        }\n#endif\n\n    private:\n\n        Container const& m_values;\n    };\n\n    template <typename K, typename V, typename Container>\n    auto make_input_map_view(Container&& values)\n    {\n        return make<input_map_view<K, V, Container>>(std::forward<Container>(values));\n    }\n\n    template <typename K, typename V, typename Container>\n    auto make_scoped_input_map_view(Container const& values)\n    {\n        using interface_type = wfc::IMapView<K, V>;\n        std::pair<interface_type, input_scope*> result;\n        auto ptr = new scoped_input_map_view<K, V, Container>(values);\n        *put..." /* TRUNCATED STRING LITERAL */
                );
      writer_base<cppwinrt::writer>::write
                ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_108,__buf_09,
                 (size_t)local_b8._M_str);
      psVar1 = namespace_name_local;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_118,
                 "\nnamespace winrt::impl\n{\n    template <typename T, typename Container, typename ThreadingBase>\n    struct vector_impl :\n        implements<vector_impl<T, Container, ThreadingBase>, wfc::IVector<T>, wfc::IVectorView<T>, wfc::IIterable<T>>,\n        vector_base<vector_impl<T, Container, ThreadingBase>, T>,\n        ThreadingBase\n    {\n        static_assert(std::is_same_v<Container, std::remove_reference_t<Container>>, \"Must be constructed with rvalue.\");\n\n        explicit vector_impl(Container&& values) : m_values(std::forward<Container>(values))\n        {\n        }\n\n        auto& get_container() noexcept\n        {\n            return m_values;\n        }\n\n        auto& get_container() const noexcept\n        {\n            return m_values;\n        }\n\n        using ThreadingBase::acquire_shared;\n        using ThreadingBase::acquire_exclusive;\n\n    private:\n\n        Container m_values;\n    };\n\n    template <typename T, typename Container>\n    using input_vector = vector_impl<T, Container, single_threaded_collection_base>;\n}\n\nWINRT_EXPORT namespace winrt::param\n{\n    template <typename T>\n    struct vector\n    {\n        using value_type = T;\n        using interface_type = Windows::Foundation::Collections::IVector<value_type>;\n\n        vector(std::nullptr_t) noexcept\n        {\n        }\n\n        vector(vector const& values) = delete;\n        vector& operator=(vector const& values) = delete;\n\n        vector(interface_type const& values) noexcept : m_owned(false)\n        {\n            attach_abi(m_interface, winrt::get_abi(values));\n        }\n\n        template <typename Collection, std::enable_if_t<std::is_convertible_v<Collection, interface_type>, int> = 0>\n        vector(Collection const& values) noexcept\n        {\n            m_interface = values;\n        }\n\n        template <typename Allocator>\n        vector(std::vector<value_type, Allocator>&& values) :\n            m_interface(make<impl::input_vector<value_type, std::vector<value_type, Allocator>>>(std::move(values)))\n        {\n        }\n\n        vector(std::initializer..." /* TRUNCATED STRING LITERAL */
                );
      writer_base<cppwinrt::writer>::write
                ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_118,__buf_10,
                 (size_t)local_b8._M_str);
      psVar1 = namespace_name_local;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_128,
                 "\nnamespace winrt::impl\n{\n    template <typename K, typename V, typename Container, typename ThreadingBase>\n    struct map_impl :\n        implements<map_impl<K, V, Container, ThreadingBase>, wfc::IMap<K, V>, wfc::IMapView<K, V>, wfc::IIterable<wfc::IKeyValuePair<K, V>>>,\n        map_base<map_impl<K, V, Container, ThreadingBase>, K, V>,\n        ThreadingBase\n    {\n        static_assert(std::is_same_v<Container, std::remove_reference_t<Container>>, \"Must be constructed with rvalue.\");\n\n        explicit map_impl(Container&& values) : m_values(std::forward<Container>(values))\n        {\n        }\n\n        auto& get_container() noexcept\n        {\n            return m_values;\n        }\n\n        auto& get_container() const noexcept\n        {\n            return m_values;\n        }\n\n        using ThreadingBase::acquire_shared;\n        using ThreadingBase::acquire_exclusive;\n\n    private:\n\n        Container m_values;\n    };\n\n    template <typename K, typename V, typename Container>\n    using input_map = map_impl<K, V, Container, single_threaded_collection_base>;\n\n    template <typename K, typename V, typename Container>\n    auto make_input_map(Container&& values)\n    {\n        return make<input_map<K, V, Container>>(std::forward<Container>(values));\n    }\n}\n\nWINRT_EXPORT namespace winrt::param\n{\n    template <typename K, typename V>\n    struct map\n    {\n        using value_type = Windows::Foundation::Collections::IKeyValuePair<K, V>;\n        using interface_type = Windows::Foundation::Collections::IMap<K, V>;\n\n        map(std::nullptr_t) noexcept\n        {\n        }\n\n        map(map const& values) = delete;\n        map& operator=(map const& values) = delete;\n\n        map(interface_type const& values) noexcept : m_owned(false)\n        {\n            attach_abi(m_interface, winrt::get_abi(values));\n        }\n\n        template <typename Collection, std::enable_if_t<std::is_convertible_v<Collection, interface_type>, int> = 0>\n        map(Collection const& values) noexcept\n        {\n            m_interface = values;\n        }\n\n   ..." /* TRUNCATED STRING LITERAL */
                );
      writer_base<cppwinrt::writer>::write
                ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_128,__buf_11,
                 (size_t)local_b8._M_str);
      psVar1 = namespace_name_local;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_138,
                 "\nnamespace winrt::impl\n{\n    template <typename T, typename Container>\n    using multi_threaded_vector = vector_impl<T, Container, multi_threaded_collection_base>;\n\n    template <typename Container, typename ThreadingBase = single_threaded_collection_base>\n    struct inspectable_observable_vector :\n        observable_vector_base<inspectable_observable_vector<Container, ThreadingBase>, Windows::Foundation::IInspectable>,\n        implements<inspectable_observable_vector<Container, ThreadingBase>,\n        wfc::IObservableVector<Windows::Foundation::IInspectable>, wfc::IVector<Windows::Foundation::IInspectable>, wfc::IVectorView<Windows::Foundation::IInspectable>, wfc::IIterable<Windows::Foundation::IInspectable>>,\n        ThreadingBase\n    {\n        static_assert(std::is_same_v<Container, std::remove_reference_t<Container>>, \"Must be constructed with rvalue.\");\n\n        explicit inspectable_observable_vector(Container&& values) : m_values(std::forward<Container>(values))\n        {\n        }\n\n        auto& get_container() noexcept\n        {\n            return m_values;\n        }\n\n        auto& get_container() const noexcept\n        {\n            return m_values;\n        }\n\n        using ThreadingBase::acquire_shared;\n        using ThreadingBase::acquire_exclusive;\n\n    private:\n\n        Container m_values;\n    };\n\n    template <typename Container>\n    using multi_threaded_inspectable_observable_vector = inspectable_observable_vector<Container, multi_threaded_collection_base>;\n\n    template <typename T, typename Container, typename ThreadingBase = single_threaded_collection_base>\n    struct convertible_observable_vector :\n        observable_vector_base<convertible_observable_vector<T, Container, ThreadingBase>, T>,\n        implements<convertible_observable_vector<T, Container, ThreadingBase>,\n        wfc::IObservableVector<T>, wfc::IVector<T>, wfc::IVectorView<T>, wfc::IIterable<T>,\n        wfc::IObservableVector<Windows::Foundation::IInspectable>, wfc::IVector<Windows::Foundation::IInspectable>, wfc::IVectorView<Wind..." /* TRUNCATED STRING LITERAL */
                );
      writer_base<cppwinrt::writer>::write
                ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_138,__buf_12,
                 (size_t)local_b8._M_str);
      psVar1 = namespace_name_local;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_148,
                 "\nnamespace winrt::impl\n{\n    template <typename K, typename V, typename Container>\n    using multi_threaded_map = map_impl<K, V, Container, multi_threaded_collection_base>;\n\n    template <typename K, typename V, typename Container, typename ThreadingBase>\n    struct observable_map_impl :\n        implements<observable_map_impl<K, V, Container, ThreadingBase>, wfc::IObservableMap<K, V>, wfc::IMap<K, V>, wfc::IMapView<K, V>, wfc::IIterable<wfc::IKeyValuePair<K, V>>>,\n        observable_map_base<observable_map_impl<K, V, Container, ThreadingBase>, K, V>,\n        ThreadingBase\n    {\n        static_assert(std::is_same_v<Container, std::remove_reference_t<Container>>, \"Must be constructed with rvalue.\");\n\n        explicit observable_map_impl(Container&& values) : m_values(std::forward<Container>(values))\n        {\n        }\n\n        auto& get_container() noexcept\n        {\n            return m_values;\n        }\n\n        auto& get_container() const noexcept\n        {\n            return m_values;\n        }\n\n        using ThreadingBase::acquire_shared;\n        using ThreadingBase::acquire_exclusive;\n\n    private:\n\n        Container m_values;\n    };\n\n    template <typename K, typename V, typename Container>\n    using observable_map = observable_map_impl<K, V, Container, single_threaded_collection_base>;\n\n    template <typename K, typename V, typename Container>\n    using multi_threaded_observable_map = observable_map_impl<K, V, Container, multi_threaded_collection_base>;\n}\n\nWINRT_EXPORT namespace winrt\n{\n    template <typename K, typename V, typename Compare = std::less<K>, typename Allocator = std::allocator<std::pair<K const, V>>>\n    Windows::Foundation::Collections::IMap<K, V> single_threaded_map()\n    {\n        return make<impl::input_map<K, V, std::map<K, V, Compare, Allocator>>>(std::map<K, V, Compare, Allocator>{});\n    }\n\n    template <typename K, typename V, typename Compare = std::less<K>, typename Allocator = std::allocator<std::pair<K const, V>>>\n    Windows::Foundation::Collections::IMap<K, V> single_threaded_..." /* TRUNCATED STRING LITERAL */
                );
      writer_base<cppwinrt::writer>::write
                ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_148,__buf_13,
                 (size_t)local_b8._M_str);
    }
    else {
      local_158 = local_18->_M_len;
      local_150 = local_18->_M_str;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_168,"Windows.System");
      __x_04._M_str = local_150;
      __x_04._M_len = local_158;
      __y_04._M_str = local_168._M_str;
      __y_04._M_len = local_168._M_len;
      bVar2 = ::std::operator==(__x_04,__y_04);
      psVar1 = namespace_name_local;
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_178,
                   "\nWINRT_EXPORT namespace winrt\n{\n    [[nodiscard]] inline auto resume_foreground(\n        Windows::System::DispatcherQueue const& dispatcher,\n        Windows::System::DispatcherQueuePriority const priority = Windows::System::DispatcherQueuePriority::Normal) noexcept\n    {\n        struct awaitable\n        {\n            awaitable(Windows::System::DispatcherQueue const& dispatcher, Windows::System::DispatcherQueuePriority const priority) noexcept :\n                m_dispatcher(dispatcher),\n                m_priority(priority)\n            {\n            }\n\n            bool await_ready() const noexcept\n            {\n                return false;\n            }\n\n            bool await_resume() const noexcept\n            {\n                return m_queued;\n            }\n\n            bool await_suspend(impl::coroutine_handle<> handle)\n            {\n                return m_dispatcher.TryEnqueue(m_priority, [handle, this]\n                    {\n                        m_queued = true;\n                        handle();\n                    });\n            }\n\n        private:\n            Windows::System::DispatcherQueue const& m_dispatcher;\n            Windows::System::DispatcherQueuePriority const m_priority;\n            bool m_queued{};\n        };\n\n        return awaitable{ dispatcher, priority };\n    };\n\n#ifdef WINRT_IMPL_COROUTINES\n    inline auto operator co_await(Windows::System::DispatcherQueue const& dispatcher)\n    {\n        return resume_foreground(dispatcher);\n    }\n#endif\n}\n"
                  );
        writer_base<cppwinrt::writer>::write
                  ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_178,__buf_14,
                   (size_t)local_168._M_str);
      }
      else {
        local_188 = local_18->_M_len;
        local_180 = local_18->_M_str;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_198,"Microsoft.System");
        __x_03._M_str = local_180;
        __x_03._M_len = local_188;
        __y_03._M_str = local_198._M_str;
        __y_03._M_len = local_198._M_len;
        bVar2 = ::std::operator==(__x_03,__y_03);
        psVar1 = namespace_name_local;
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_1a8,
                     "\nWINRT_EXPORT namespace winrt\n{\n    [[nodiscard]] inline auto resume_foreground(\n        Microsoft::System::DispatcherQueue const& dispatcher,\n        Microsoft::System::DispatcherQueuePriority const priority = Microsoft::System::DispatcherQueuePriority::Normal) noexcept\n    {\n        struct awaitable\n        {\n            awaitable(Microsoft::System::DispatcherQueue const& dispatcher, Microsoft::System::DispatcherQueuePriority const priority) noexcept :\n                m_dispatcher(dispatcher),\n                m_priority(priority)\n            {\n            }\n\n            bool await_ready() const noexcept\n            {\n                return false;\n            }\n\n            bool await_resume() const noexcept\n            {\n                return m_queued;\n            }\n\n            bool await_suspend(impl::coroutine_handle<> handle)\n            {\n                return m_dispatcher.TryEnqueue(m_priority, [handle, this]\n                    {\n                        m_queued = true;\n                        handle();\n                    });\n            }\n\n        private:\n            Microsoft::System::DispatcherQueue const& m_dispatcher;\n            Microsoft::System::DispatcherQueuePriority const m_priority;\n            bool m_queued{};\n        };\n\n        return awaitable{ dispatcher, priority };\n    };\n\n#ifdef WINRT_IMPL_COROUTINES\n    inline auto operator co_await(Microsoft::System::DispatcherQueue const& dispatcher)\n    {\n        return resume_foreground(dispatcher);\n    }\n#endif\n}\n"
                    );
          writer_base<cppwinrt::writer>::write
                    ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_1a8,__buf_15,
                     (size_t)local_198._M_str);
        }
        else {
          local_1b8 = local_18->_M_len;
          local_1b0 = local_18->_M_str;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_1c8,"Windows.UI.Core");
          __x_02._M_str = local_1b0;
          __x_02._M_len = local_1b8;
          __y_02._M_str = local_1c8._M_str;
          __y_02._M_len = local_1c8._M_len;
          bVar2 = ::std::operator==(__x_02,__y_02);
          psVar1 = namespace_name_local;
          if (bVar2) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_1d8,
                       "\nWINRT_EXPORT namespace winrt\n{\n    [[nodiscard]] inline auto resume_foreground(\n        Windows::UI::Core::CoreDispatcher const& dispatcher,\n        Windows::UI::Core::CoreDispatcherPriority const priority = Windows::UI::Core::CoreDispatcherPriority::Normal) noexcept\n    {\n        struct awaitable\n        {\n            awaitable(Windows::UI::Core::CoreDispatcher const& dispatcher, Windows::UI::Core::CoreDispatcherPriority const priority) noexcept :\n                m_dispatcher(dispatcher),\n                m_priority(priority)\n            {\n            }\n\n            bool await_ready() const noexcept\n            {\n                return false;\n            }\n\n            void await_resume() const noexcept\n            {\n            }\n\n            void await_suspend(impl::coroutine_handle<> handle) const\n            {\n                m_dispatcher.RunAsync(m_priority, [handle]\n                    {\n                        handle();\n                    });\n            }\n\n        private:\n\n            Windows::UI::Core::CoreDispatcher const& m_dispatcher;\n            Windows::UI::Core::CoreDispatcherPriority const m_priority;\n        };\n\n        return awaitable{ dispatcher, priority };\n    };\n\n#ifdef WINRT_IMPL_COROUTINES\n    inline auto operator co_await(Windows::UI::Core::CoreDispatcher const& dispatcher)\n    {\n        return resume_foreground(dispatcher);\n    }\n#endif\n}\n"
                      );
            writer_base<cppwinrt::writer>::write
                      ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_1d8,__buf_16,
                       (size_t)local_1c8._M_str);
          }
          else {
            local_1e8 = local_18->_M_len;
            local_1e0 = local_18->_M_str;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_1f8,"Windows.UI.Xaml.Interop");
            __x_01._M_str = local_1e0;
            __x_01._M_len = local_1e8;
            __y_01._M_str = local_1f8._M_str;
            __y_01._M_len = local_1f8._M_len;
            bVar2 = ::std::operator==(__x_01,__y_01);
            psVar1 = namespace_name_local;
            if (bVar2) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_208,
                         "\nnamespace winrt::impl\n{\n    template <typename T>\n    struct xaml_typename_name\n    {\n        static constexpr std::wstring_view value() noexcept\n        {\n            return name_of<T>();\n        }\n    };\n    template <>\n    struct xaml_typename_name<Windows::Foundation::Point>\n    {\n        static constexpr std::wstring_view value() noexcept\n        {\n            return L\"Point\"sv;\n        }\n    };\n    template <>\n    struct xaml_typename_name<Windows::Foundation::Size>\n    {\n        static constexpr std::wstring_view value() noexcept\n        {\n            return L\"Size\"sv;\n        }\n    };\n    template <>\n    struct xaml_typename_name<Windows::Foundation::Rect>\n    {\n        static constexpr std::wstring_view value() noexcept\n        {\n            return L\"Rect\"sv;\n        }\n    };\n    template <>\n    struct xaml_typename_name<Windows::Foundation::DateTime>\n    {\n        static constexpr std::wstring_view value() noexcept\n        {\n            return L\"DateTime\"sv;\n        }\n    };\n    template <>\n    struct xaml_typename_name<Windows::Foundation::TimeSpan>\n    {\n        static constexpr std::wstring_view value() noexcept\n        {\n            return L\"TimeSpan\"sv;\n        }\n    };\n\n    template <typename T>\n    struct xaml_typename_kind\n    {\n        static constexpr Windows::UI::Xaml::Interop::TypeKind value = Windows::UI::Xaml::Interop::TypeKind::Metadata;\n    };\n    template<>\n    struct xaml_typename_kind<bool>\n    {\n        static constexpr Windows::UI::Xaml::Interop::TypeKind value = Windows::UI::Xaml::Interop::TypeKind::Primitive;\n    };\n    template<>\n    struct xaml_typename_kind<char16_t>\n    {\n        static constexpr Windows::UI::Xaml::Interop::TypeKind value = Windows::UI::Xaml::Interop::TypeKind::Primitive;\n    };\n    template<>\n    struct xaml_typename_kind<uint8_t>\n    {\n        static constexpr Windows::UI::Xaml::Interop::TypeKind value = Windows::UI::Xaml::Interop::TypeKind::Primitive;\n    };\n    template<>\n    struct xaml_typename_kind<int8_t>\n    {\n        static constexpr Windows::UI::Xa..." /* TRUNCATED STRING LITERAL */
                        );
              writer_base<cppwinrt::writer>::write
                        ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_208,__buf_17,
                         (size_t)local_1f8._M_str);
            }
            else {
              local_218 = local_18->_M_len;
              local_210 = local_18->_M_str;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_228,"Windows.UI.Xaml.Markup");
              __x_00._M_str = local_210;
              __x_00._M_len = local_218;
              __y_00._M_str = local_228._M_str;
              __y_00._M_len = local_228._M_len;
              bVar2 = ::std::operator==(__x_00,__y_00);
              psVar1 = namespace_name_local;
              if (bVar2) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_238,
                           "\nWINRT_EXPORT namespace winrt::Windows::UI::Xaml::Markup\n{\n    template <typename D>\n    struct ComponentConnectorT : D\n    {\n        using composable_base = typename D::composable_base;\n\n        void InitializeComponent()\n        {\n            if constexpr (m_has_connectable_base)\n            {\n                m_dispatch_base = true;\n                composable_base::InitializeComponent();\n                m_dispatch_base = false;\n            }\n            D::InitializeComponent();\n        }\n\n        void Connect(int32_t connectionId, winrt::Windows::Foundation::IInspectable const& target)\n        {\n            if constexpr (m_has_connectable_base)\n            {\n                if (m_dispatch_base)\n                {\n                    composable_base::Connect(connectionId, target);\n                    return;\n                }\n            }\n            D::Connect(connectionId, target);\n        }\n\n        auto GetBindingConnector(int32_t connectionId, winrt::Windows::Foundation::IInspectable const& target)\n        {\n            if constexpr (m_has_connectable_base)\n            {\n                if (m_dispatch_base)\n                {\n                    return composable_base::GetBindingConnector(connectionId, target);\n                }\n            }\n            return D::GetBindingConnector(connectionId, target);\n        }\n\n    private:\n        static constexpr bool m_has_connectable_base{\n            impl::has_initializer<composable_base>::value &&\n            impl::has_interface<D, IComponentConnector>() &&\n            impl::has_interface<D, IComponentConnector2>() };\n\n        bool m_dispatch_base{};\n    };\n}\n"
                          );
                writer_base<cppwinrt::writer>::write
                          ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_238,__buf_18,
                           (size_t)local_228._M_str);
              }
              else {
                local_248 = local_18->_M_len;
                local_240 = local_18->_M_str;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_258,"Microsoft.UI.Xaml.Markup");
                __x._M_str = local_240;
                __x._M_len = local_248;
                __y._M_str = local_258._M_str;
                __y._M_len = local_258._M_len;
                bVar2 = ::std::operator==(__x,__y);
                psVar1 = namespace_name_local;
                if (bVar2) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_268,
                             "\nWINRT_EXPORT namespace winrt::Microsoft::UI::Xaml::Markup\n{\n    template <typename D>\n    struct ComponentConnectorT : D\n    {\n        using composable_base = typename D::composable_base;\n\n        void InitializeComponent()\n        {\n            if constexpr (m_has_connectable_base)\n            {\n                m_dispatch_base = true;\n                composable_base::InitializeComponent();\n                m_dispatch_base = false;\n            }\n            D::InitializeComponent();\n        }\n\n        void Connect(int32_t connectionId, winrt::Windows::Foundation::IInspectable const& target)\n        {\n            if constexpr (m_has_connectable_base)\n            {\n                if (m_dispatch_base)\n                {\n                    composable_base::Connect(connectionId, target);\n                    return;\n                }\n            }\n            D::Connect(connectionId, target);\n        }\n\n        auto GetBindingConnector(int32_t connectionId, winrt::Windows::Foundation::IInspectable const& target)\n        {\n            if constexpr (m_has_connectable_base)\n            {\n                if (m_dispatch_base)\n                {\n                    return composable_base::GetBindingConnector(connectionId, target);\n                }\n            }\n            return D::GetBindingConnector(connectionId, target);\n        }\n\n    private:\n        static constexpr bool m_has_connectable_base{\n            impl::has_initializer<composable_base>::value &&\n            impl::has_interface<D, IComponentConnector>() };\n\n        bool m_dispatch_base{};\n    };\n}\n"
                            );
                  writer_base<cppwinrt::writer>::write
                            ((writer_base<cppwinrt::writer> *)psVar1,(int)&local_268,__buf_19,
                             (size_t)local_258._M_str);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void write_namespace_special(writer& w, std::string_view const& namespace_name)
    {
        if (namespace_name == "Windows.Foundation")
        {
            w.write(strings::base_reference_produce);
            w.write(strings::base_deferral);
            w.write(strings::base_coroutine_foundation);
            w.write(strings::base_stringable_to_hstring);
            w.write(strings::base_stringable_format);
            w.write(strings::base_stringable_streams);
        }
        else if (namespace_name == "Windows.Foundation.Collections")
        {
            w.write(strings::base_collections);
            w.write(strings::base_collections_base);
            w.write(strings::base_collections_input_iterable);
            w.write(strings::base_collections_input_vector_view);
            w.write(strings::base_collections_input_map_view);
            w.write(strings::base_collections_input_vector);
            w.write(strings::base_collections_input_map);
            w.write(strings::base_collections_vector);
            w.write(strings::base_collections_map);
        }
        else if (namespace_name == "Windows.System")
        {
            w.write(strings::base_coroutine_system);
        }
        else if (namespace_name == "Microsoft.System")
        {
            w.write(strings::base_coroutine_system_winui);
        }
        else if (namespace_name == "Windows.UI.Core")
        {
            w.write(strings::base_coroutine_ui_core);
        }
        else if (namespace_name == "Windows.UI.Xaml.Interop")
        {
            w.write(strings::base_xaml_typename);
        }
        else if (namespace_name == "Windows.UI.Xaml.Markup")
        {
            w.write(strings::base_xaml_component_connector);
        }
        else if (namespace_name == "Microsoft.UI.Xaml.Markup")
        {
            w.write(strings::base_xaml_component_connector_winui);
        }
    }